

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _func_int **pp_Var6;
  int iVar7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  int iVar10;
  srv_config *__tmp;
  element_type *peVar11;
  buffer *buf;
  iterator iVar12;
  uint64_t uVar13;
  uint *puVar14;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  ulong uVar16;
  ptr<resp_msg> pVar17;
  ptr<raft_params> pVar18;
  undefined1 auVar19 [16];
  ptr<srv_config> srv_conf;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  undefined1 local_59;
  uint *local_58;
  _Alloc_hider _Stack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar11 = (element_type *)operator_new(0xb0);
  (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar11->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005be3a0;
  uVar1 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)((long)&req->commit_idx_ + 4);
  _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2;
  (peVar11->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar11->bg_append_thread_)._M_id._M_thread = 7;
  *(undefined4 *)((long)&(peVar11->bg_append_thread_)._M_id._M_thread + 4) = uVar1;
  *(uint *)&peVar11->bg_append_ea_ = uVar2;
  (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005be3f0;
  (peVar11->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar11->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(peVar11->priority_change_timer_).first_event_fired_ = 0;
  (peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  peVar11->votes_responded_ = 0;
  peVar11->votes_granted_ = 0;
  (peVar11->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar11->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar11->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(peVar11->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar11->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar11->field_0x31 = 0;
  peVar11->leader_ = (__atomic_base<int>)0x0;
  peVar11->id_ = 0;
  peVar11->my_priority_ = 0;
  *(undefined1 *)&peVar11->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) != 0x10) ||
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) != '\x03')) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 != (pointer)0x0) {
      iVar10 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var15._M_pi = extraout_RDX_02;
      if (4 < iVar10) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&local_80,
                   "bad add server request as we are expecting one log entry with value type of ClusterServer"
                  );
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x30,&local_80);
        _Var15._M_pi = extraout_RDX_03;
        if ((code **)local_80._M_unused._0_8_ != &local_70) {
          operator_delete(local_80._M_unused._M_object);
          _Var15._M_pi = extraout_RDX_04;
        }
      }
    }
    *(undefined4 *)&(peVar11->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffffc
    ;
    goto LAB_0019a5f7;
  }
  if ((*(int *)&req[8].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 3) ||
     (((ulong)req[3].super_msg_base._vptr_msg_base & 1) != 0)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 != (pointer)0x0) {
      iVar10 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var15._M_pi = extraout_RDX;
      if (1 < iVar10) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&local_80,"this is not a leader, cannot handle AddServerRequest");
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x36,&local_80);
        _Var15._M_pi = extraout_RDX_00;
        if ((code **)local_80._M_unused._0_8_ != &local_70) {
          operator_delete(local_80._M_unused._M_object);
          _Var15._M_pi = extraout_RDX_01;
        }
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffd;
    goto LAB_0019a5f7;
  }
  check_srv_to_leave_timeout((raft_server *)req);
  buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
  srv_config::deserialize((srv_config *)&local_58,buf);
  local_80._0_4_ = *local_58;
  iVar12 = std::
           _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(req + 6),(key_type_conflict *)local_80._M_pod_data);
  _Var15._M_pi = extraout_RDX_05;
  if (iVar12.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    if (*(uint *)&(req->log_entries_).
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == *local_58) goto LAB_0019a65b;
    if (*(char *)((long)&req[2].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01') {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar4 != (pointer)0x0) {
        iVar10 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)();
        _Var15._M_pi = extraout_RDX_10;
        if (2 < iVar10) {
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_((string *)&local_80,"previous config has not committed yet");
          (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_add_srv_req",0x4a,&local_80);
          _Var15._M_pi = extraout_RDX_11;
          if ((code **)local_80._M_unused._0_8_ != &local_70) {
            operator_delete(local_80._M_unused._M_object);
            _Var15._M_pi = extraout_RDX_12;
          }
        }
      }
      *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffa;
    }
    else {
      puVar14 = local_58;
      if (req[0xb].commit_idx_ != 0) {
        uVar13 = timer_helper::get_us((timer_helper *)(req[0xb].commit_idx_ + 0x180));
        uVar16 = uVar13 / 1000;
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar10 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ();
          if (2 < iVar10) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&local_80,
                       "previous adding server (%d) is in progress, last activity: %lu ms ago",
                       (ulong)**(uint **)req[0xb].commit_idx_,uVar16);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x57,&local_80);
            if ((code **)local_80._M_unused._0_8_ != &local_70) {
              operator_delete(local_80._M_unused._M_object);
            }
          }
        }
        iVar7 = DAT_005db990;
        pVar18 = context::get_params((context *)&local_80);
        _Var15 = pVar18.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        iVar10 = *(int *)(local_80._M_unused._M_function_pointer + 8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
          _Var15._M_pi = extraout_RDX_13;
        }
        if (uVar16 <= (ulong)((long)iVar10 * (long)iVar7)) {
          *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff9;
          goto LAB_0019a6da;
        }
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar10 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ();
          if (2 < iVar10) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&local_80,"activity timeout (last activity %lu ms ago), start over"
                       ,uVar16);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x61,&local_80);
            if ((code **)local_80._M_unused._0_8_ != &local_70) {
              operator_delete(local_80._M_unused._M_object);
            }
          }
        }
        reset_srv_to_join((raft_server *)req);
        puVar14 = local_58;
      }
      _Var8._M_p = _Stack_50._M_p;
      local_58 = (uint *)0x0;
      _Stack_50._M_p = (pointer)0x0;
      *(uint **)&req[0xc].super_msg_base.type_ = puVar14;
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&req[0xc].super_msg_base.dst_;
      *(pointer *)&req[0xc].super_msg_base.dst_ = _Var8._M_p;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      local_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80._M_unused._M_object = operator_new(0x18);
      *(code **)local_80._M_unused._0_8_ = handle_hb_timeout;
      *(code **)((long)local_80._M_unused._0_8_ + 8) = (code *)0x0;
      *(req_msg **)((long)local_80._M_unused._0_8_ + 0x10) = req;
      local_68 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_manager;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::peer,std::allocator<nuraft::peer>,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_40._M_allocated_capacity,
                 (peer **)&local_48,(allocator<nuraft::peer> *)&local_59,
                 (shared_ptr<nuraft::srv_config> *)&req[0xc].super_msg_base.type_,
                 *(context **)&req[4].super_msg_base.dst_,(function<void_(int)> *)&local_80,
                 (shared_ptr<nuraft::logger> *)
                 &req[9].log_entries_.
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar9 = aStack_40._M_allocated_capacity;
      _Var15._M_pi = local_48._M_pi;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_40._M_allocated_capacity = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               req[0xb].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      req[0xb].commit_idx_ = (ulong)_Var15._M_pi;
      req[0xb].log_entries_.
      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar9;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity
                    );
        }
      }
      invite_srv_to_join_cluster((raft_server *)req);
      pp_Var6 = this->_vptr_raft_server;
      auVar19 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      _Var15._M_pi = auVar19._8_8_;
      pp_Var6[4] = auVar19._0_8_;
      *(undefined1 *)(pp_Var6 + 6) = 1;
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,3);
        _Var15._M_pi = extraout_RDX_14;
      }
    }
  }
  else {
LAB_0019a65b:
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 != (pointer)0x0) {
      iVar10 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var15._M_pi = extraout_RDX_06;
      if (2 < iVar10) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&local_80,
                   "the server to be added has a duplicated id with existing server %d",
                   (ulong)*local_58);
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x43,&local_80);
        _Var15._M_pi = extraout_RDX_07;
        if ((code **)local_80._M_unused._0_8_ != &local_70) {
          operator_delete(local_80._M_unused._M_object);
          _Var15._M_pi = extraout_RDX_08;
        }
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffb;
  }
LAB_0019a6da:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    _Var15._M_pi = extraout_RDX_09;
  }
LAB_0019a5f7:
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req) {
    std::vector< ptr<log_entry> >& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::add_server_response,
                           id_,
                           leader_ );

    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::cluster_server ) {
        p_db( "bad add server request as we are expecting one log entry "
              "with value type of ClusterServer" );
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_er("this is not a leader, cannot handle AddServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    // Before checking duplicate ID, confirm srv_to_leave_ is gone.
    check_srv_to_leave_timeout();
    ptr<srv_config> srv_conf =
        srv_config::deserialize( entries[0]->get_buf() );
    if ( peers_.find( srv_conf->get_id() ) != peers_.end() ||
         id_ == srv_conf->get_id() ) {
        p_wn( "the server to be added has a duplicated "
              "id with existing server %d",
              srv_conf->get_id() );
        resp->set_result_code(cmd_result_code::SERVER_ALREADY_EXISTS);
        return resp;
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    if (srv_to_join_) {
        // Adding server is already in progress.

        // Check the last active time of that server.
        ulong last_active_ms = srv_to_join_->get_active_timer_us() / 1000;
        p_wn("previous adding server (%d) is in progress, "
             "last activity: %" PRIu64 " ms ago",
             srv_to_join_->get_id(),
             last_active_ms);

        if ( last_active_ms <=
                 (ulong)raft_server::raft_limits_.response_limit_ *
                 ctx_->get_params()->heart_beat_interval_ ) {
            resp->set_result_code(cmd_result_code::SERVER_IS_JOINING);
            return resp;
        }
        // Otherwise: activity timeout, reset the server.
        p_wn("activity timeout (last activity %" PRIu64 " ms ago), start over",
             last_active_ms);
        reset_srv_to_join();
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<int32>::executor exec =
        (timer_task<int32>::executor)
        std::bind( &raft_server::handle_hb_timeout,
                   this,
                   std::placeholders::_1 );
    srv_to_join_ = cs_new< peer,
                           ptr<srv_config>&,
                           context&,
                           timer_task<int32>::executor&,
                           ptr<logger>& >
                         ( conf_to_add_, *ctx_, exec, l_ );
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}